

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void printXMLOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  CmdOptDesc *pCVar1;
  TidyConfigCategory TVar2;
  int iVar3;
  ctmbstr ptVar4;
  TidyOption topt_00;
  size_t __n;
  tmbstr ptVar5;
  char *pcVar6;
  CmdOptDesc *pCVar7;
  TidyIterator pos;
  CmdOptDesc localHit;
  TidyIterator local_98 [8];
  CmdOptDesc local_58;
  
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 != TidyInternalCategory) {
    printf(" <option class=\"%s\">\n",d->cat);
    printf("  <name>%s</name>\n",d->name);
    printf("  <type>%s</type>\n",d->type);
    if (d->def == (ctmbstr)0x0) {
      puts("  <default />");
    }
    else {
      printf("  <default>%s</default>\n");
    }
    if (d->haveVals == no) {
      pcVar6 = "  <example />";
    }
    else {
      printf("  <example>");
      if (d->vals == (ctmbstr)0x0) {
        local_98[0] = tidyOptGetPickList(topt);
        if (local_98[0] != (TidyIterator)0x0) {
          ptVar4 = tidyOptGetNextPick(topt,local_98);
          printf(anon_var_dwarf_1a594 + 0x16,ptVar4);
          while (local_98[0] != (TidyIterator)0x0) {
            printf(", ");
            ptVar4 = tidyOptGetNextPick(topt,local_98);
            printf(anon_var_dwarf_1a594 + 0x16,ptVar4);
          }
        }
      }
      else {
        printf(anon_var_dwarf_1a594 + 0x16);
      }
      pcVar6 = "</example>";
    }
    puts(pcVar6);
    ptVar4 = tidyOptGetDoc(tdoc,topt);
    if (ptVar4 == (ctmbstr)0x0) {
      printXMLOption_cold_1();
    }
    else {
      printf("  <description>%s</description>\n",ptVar4);
    }
    local_98[0] = tidyOptGetDocLinksList(tdoc,topt);
    while (local_98[0] != (TidyIterator)0x0) {
      topt_00 = tidyOptGetNextDocLinks(tdoc,local_98);
      ptVar4 = tidyOptGetName(topt_00);
      printf("  <seealso>%s</seealso>\n",ptVar4);
    }
    pCVar7 = cmdopt_defs;
    local_98[0] = (TidyIterator)0x0;
    do {
      ptVar4 = tidyOptGetName(topt);
      snprintf((char *)local_98,0x32,"%s:",ptVar4);
      pcVar6 = pCVar7->eqconfig;
      if (pcVar6 != (char *)0x0) {
        __n = strlen((char *)local_98);
        iVar3 = strncmp((char *)local_98,pcVar6,__n);
        if (iVar3 == 0) goto LAB_00132de0;
      }
      pCVar1 = pCVar7 + 1;
      pCVar7 = pCVar7 + 1;
    } while (pCVar1->name1 != (ctmbstr)0x0);
    pCVar7 = (CmdOptDesc *)0x0;
LAB_00132de0:
    if (pCVar7 == (CmdOptDesc *)0x0) {
      printf("  %s\n","  <eqconsole />");
    }
    else {
      local_58.cat = pCVar7->cat;
      local_58._4_4_ = *(undefined4 *)&pCVar7->field_0x4;
      local_58.name1 = pCVar7->name1;
      local_58.key = pCVar7->key;
      local_58.subKey = pCVar7->subKey;
      local_58.eqconfig = pCVar7->eqconfig;
      local_58.name2 = pCVar7->name2;
      local_58.name3 = pCVar7->name3;
      localize_option_names(&local_58);
      ptVar4 = local_58.name1;
      ptVar5 = get_escaped_name(local_58.name1);
      printf("  <eqconsole>%s</eqconsole>\n",ptVar5);
      free(ptVar4);
      free(ptVar5);
      ptVar4 = local_58.name2;
      if (local_58.name2 != (ctmbstr)0x0) {
        ptVar5 = get_escaped_name(local_58.name2);
        printf("  <eqconsole>%s</eqconsole>\n",ptVar5);
        free(ptVar4);
        free(ptVar5);
      }
      ptVar4 = local_58.name3;
      if (local_58.name3 != (ctmbstr)0x0) {
        ptVar5 = get_escaped_name(local_58.name3);
        printf("  <eqconsole>%s</eqconsole>\n",ptVar5);
        free(ptVar4);
        free(ptVar5);
      }
      if (local_58.eqconfig != (ctmbstr)0x0) {
        free(local_58.eqconfig);
      }
    }
    puts(" </option>");
  }
  return;
}

Assistant:

static void printXMLOption(TidyDoc tdoc,    /**< The Tidy document. */
                           TidyOption topt, /**< The option. */
                           OptionDesc *d    /**< The OptionDesc for the option. */
                           )
{
    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    printf( " <option class=\"%s\">\n", d->cat );
    printf  ("  <name>%s</name>\n",d->name);
    printf  ("  <type>%s</type>\n",d->type);
    if (d->def)
        printf("  <default>%s</default>\n",d->def);
    else
        printf("  <default />\n");
    if (d->haveVals)
    {
        printf("  <example>");
        PrintAllowedValues( topt, d );
        printf("</example>\n");
    }
    else
    {
        printf("  <example />\n");
    }
    printXMLDescription( tdoc, topt );
    printXMLCrossRef( tdoc, topt );
    printXMLCrossRefEqConsole( tdoc, topt );
    printf( " </option>\n" );
}